

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var10;
  uint uVar11;
  long lVar12;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar4 = *(int *)((long)&pjVar1[3].start_pass + 4);
    if (iVar4 == 0) {
      process_restart(cinfo);
      iVar4 = *(int *)((long)&pjVar1[3].start_pass + 4);
    }
    *(int *)((long)&pjVar1[3].start_pass + 4) = iVar4 + -1;
  }
  if ((pjVar1[1].insufficient_data != -1) && (0 < cinfo->blocks_in_MCU)) {
    lVar9 = 0;
    do {
      paJVar2 = MCU_data[lVar9];
      lVar12 = (long)cinfo->MCU_membership[lVar9];
      iVar4 = cinfo->cur_comp_info[lVar12]->dc_tbl_no;
      p_Var10 = (&pjVar1[3].decode_mcu)[iVar4] +
                *(int *)((long)&pjVar1[2].decode_mcu + lVar12 * 4 + 4);
      iVar5 = arith_decode(cinfo,(uchar *)p_Var10);
      if (iVar5 == 0) {
        *(undefined4 *)((long)&pjVar1[2].decode_mcu + lVar12 * 4 + 4) = 0;
        uVar8 = *(uint *)(&pjVar1[1].field_0x14 + lVar12 * 4);
      }
      else {
        uVar6 = arith_decode(cinfo,(uchar *)(p_Var10 + 1));
        p_Var10 = p_Var10 + (ulong)uVar6 + 2;
        iVar5 = arith_decode(cinfo,(uchar *)p_Var10);
        uVar8 = 0;
        if (iVar5 != 0) {
          p_Var10 = (&pjVar1[3].decode_mcu)[iVar4] + 0x14;
          iVar5 = arith_decode(cinfo,(uchar *)p_Var10);
          uVar8 = 1;
          while (iVar5 != 0) {
            uVar8 = uVar8 * 2;
            if (uVar8 == 0x8000) {
              pjVar3 = cinfo->err;
              pjVar3->msg_code = 0x7e;
              (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
              pjVar1[1].insufficient_data = -1;
              return 1;
            }
            p_Var10 = p_Var10 + 1;
            iVar5 = arith_decode(cinfo,(uchar *)p_Var10);
          }
        }
        iVar5 = 0;
        if ((int)((ulong)(1L << (cinfo->arith_dc_L[iVar4] & 0x3f)) >> 1) <= (int)uVar8) {
          if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar4] & 0x3f)) >> 1) < (int)uVar8) {
            iVar5 = uVar6 * 4 + 0xc;
          }
          else {
            iVar5 = uVar6 * 4 + 4;
          }
        }
        *(int *)((long)&pjVar1[2].decode_mcu + lVar12 * 4 + 4) = iVar5;
        uVar11 = uVar8;
        if (1 < uVar8) {
          do {
            uVar8 = (int)uVar8 >> 1;
            uVar7 = arith_decode(cinfo,(uchar *)(p_Var10 + 0xe));
            if (uVar7 != 0) {
              uVar7 = uVar8;
            }
            uVar11 = uVar11 | uVar7;
          } while (1 < uVar8);
        }
        uVar8 = ~uVar11;
        if (uVar6 == 0) {
          uVar8 = uVar11 + 1;
        }
        uVar8 = uVar8 + *(int *)(&pjVar1[1].field_0x14 + lVar12 * 4) & 0xffff;
        *(uint *)(&pjVar1[1].field_0x14 + lVar12 * 4) = uVar8;
      }
      (*paJVar2)[0] = (short)uVar8 << ((byte)cinfo->Al & 0x3f);
      lVar9 = lVar9 + 1;
    } while (lVar9 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2;  st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        st = entropy->dc_stats[tbl] + 20;       /* Table F.4: X1 = 20 */
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;               /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
        entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      entropy->last_dc_val[ci] = (entropy->last_dc_val[ci] + v) & 0xffff;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF)LEFT_SHIFT(entropy->last_dc_val[ci], cinfo->Al);
  }

  return TRUE;
}